

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

void __thiscall World::SetWorldSize(World *this,int width,int height)

{
  reference this_00;
  size_type __n;
  ulong uVar1;
  
  this->worldHeight = height;
  this->worldWidth = width;
  std::
  vector<std::vector<Tiles,_std::allocator<Tiles>_>,_std::allocator<std::vector<Tiles,_std::allocator<Tiles>_>_>_>
  ::resize(&this->world,(long)height);
  __n = 0;
  uVar1 = (ulong)(uint)height;
  if (height < 1) {
    uVar1 = __n;
  }
  for (; uVar1 != __n; __n = __n + 1) {
    this_00 = std::
              vector<std::vector<Tiles,_std::allocator<Tiles>_>,_std::allocator<std::vector<Tiles,_std::allocator<Tiles>_>_>_>
              ::at(&this->world,__n);
    std::vector<Tiles,_std::allocator<Tiles>_>::resize(this_00,(long)width);
  }
  return;
}

Assistant:

void World::SetWorldSize(int width, int height)
{
	worldHeight = height;
	worldWidth = width;

	world.resize(height);
	for (int i = 0; i < height; ++i)
	{
		world.at(i).resize(width);
	}
}